

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

size_t Memory::LargeHeapBlock::GetPagesNeeded(size_t size,bool multiplyRequest)

{
  ulong uVar1;
  ulong uVar2;
  undefined3 in_register_00000031;
  
  uVar1 = -(ulong)(size >> 0x3e != 0) | size * 4;
  if (CONCAT31(in_register_00000031,multiplyRequest) == 0) {
    uVar1 = size;
  }
  uVar2 = 0xffffffffffffffff;
  if (uVar1 < 0xffffffffffffefe1) {
    uVar2 = uVar1 + 0x101f;
  }
  uVar1 = uVar2 >> 0xc;
  if (uVar2 == 0xffffffffffffffff) {
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

size_t
LargeHeapBlock::GetPagesNeeded(DECLSPEC_GUARD_OVERFLOW size_t size, bool multiplyRequest)
{
    if (multiplyRequest)
    {
        size = AllocSizeMath::Mul(size, 4);
    }

    uint pageSize = AutoSystemInfo::PageSize;
    size = AllocSizeMath::Add(size, sizeof(LargeObjectHeader) + (pageSize - 1));
    if (size == (size_t)-1)
    {
        return 0;
    }
    size_t pageCount = size / pageSize;
    return pageCount;
}